

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O0

void incdec_verify::PreDecTestUint64(void)

{
  bool bVar1;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *pSVar2;
  SafeIntException *anon_var_0;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> vv;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  size_t i;
  unsigned_long in_stack_ffffffffffffff78;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffff80;
  allocator local_61;
  string local_60 [40];
  string *local_38;
  undefined1 in_stack_ffffffffffffffd7;
  unsigned_long in_stack_ffffffffffffffd8;
  string *msg;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_18;
  byte local_9;
  ulong local_8;
  
  for (local_8 = 0; local_8 < 0x11; local_8 = local_8 + 1) {
    local_9 = 1;
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_18,(unsigned_long *)(dec_uint64 + local_8 * 0x18));
    pSVar2 = SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             ::operator--((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                           *)in_stack_ffffffffffffff80.m_int);
    local_38 = (string *)pSVar2->m_int;
    msg = local_38;
    bVar1 = operator!=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (bVar1) {
      local_9 = 0;
    }
    if ((local_9 & 1) != (dec_uint64[local_8 * 0x18 + 0x10] & 1)) {
      in_stack_ffffffffffffff80.m_int = (unsigned_long)&local_61;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_60,"Error in case dec_uint64 throw (1): ",
                 (allocator *)in_stack_ffffffffffffff80.m_int);
      err_msg<unsigned_long>(msg,in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
    }
  }
  return;
}

Assistant:

void PreDecTestUint64()
{
	size_t i;

	for( i = 0; i < COUNTOF(dec_uint64); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt<std::uint64_t> si(dec_uint64[i].x);
			SafeInt<std::uint64_t> vv = --si;

			if(vv != dec_uint64[i].y)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != dec_uint64[i].fExpected )
		{
			err_msg( "Error in case dec_uint64 throw (1): ",
			dec_uint64[i].x,
			dec_uint64[i].fExpected );
		}
	}
}